

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_simplify_numpow_xk(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  TRef TVar3;
  TRef TVar4;
  IRRef2 IVar5;
  uint uVar6;
  
  IVar5 = (J->fold).right.field_1.op12;
  uVar1 = (J->fold).ins.field_0.op1;
  if (IVar5 == 1) {
    TVar3 = (TRef)uVar1;
  }
  else {
    if (IVar5 == 0) {
      TVar3 = lj_ir_knum_u64(J,0x3ff0000000000000);
      return TVar3;
    }
    TVar3 = 0;
    if (0xfffdfffe < IVar5 - 0x10001) {
      TVar3 = (uint)uVar1;
      if ((int)IVar5 < 0) {
        TVar3 = lj_ir_knum_u64(J,0x3ff0000000000000);
        (J->fold).ins.field_0.ot = 0x2b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = uVar1;
        TVar3 = lj_opt_fold(J);
        IVar5 = -IVar5;
      }
      for (; (IVar5 & 1) == 0; IVar5 = IVar5 >> 1) {
        (J->fold).ins.field_0.ot = 0x2a0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        TVar3 = lj_opt_fold(J);
      }
      TVar4 = TVar3;
      if (1 < IVar5) {
        while( true ) {
          (J->fold).ins.field_0.ot = 0x2a0e;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
          TVar3 = lj_opt_fold(J);
          uVar6 = IVar5 >> 1;
          if (uVar6 == 1) break;
          uVar2 = IVar5 & 2;
          IVar5 = uVar6;
          if (uVar2 != 0) {
            (J->fold).ins.field_0.ot = 0x2a0e;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
            TVar4 = lj_opt_fold(J);
          }
        }
        (J->fold).ins.field_0.ot = 0x2a0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        TVar3 = lj_opt_fold(J);
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

LJFOLD(POW any KINT)
LJFOLDF(simplify_numpow_xk)
{
  int32_t k = fright->i;
  TRef ref = fins->op1;
  if (k == 0)  /* x ^ 0 ==> 1 */
    return lj_ir_knum_one(J);  /* Result must be a number, not an int. */
  if (k == 1)  /* x ^ 1 ==> x */
    return LEFTFOLD;
  if ((uint32_t)(k+65536) > 2*65536u)  /* Limit code explosion. */
    return NEXTFOLD;
  if (k < 0) {  /* x ^ (-k) ==> (1/x) ^ k. */
    ref = emitir(IRTN(IR_DIV), lj_ir_knum_one(J), ref);
    k = -k;
  }
  /* Unroll x^k for 1 <= k <= 65536. */
  for (; (k & 1) == 0; k >>= 1)  /* Handle leading zeros. */
    ref = emitir(IRTN(IR_MUL), ref, ref);
  if ((k >>= 1) != 0) {  /* Handle trailing bits. */
    TRef tmp = emitir(IRTN(IR_MUL), ref, ref);
    for (; k != 1; k >>= 1) {
      if (k & 1)
	ref = emitir(IRTN(IR_MUL), ref, tmp);
      tmp = emitir(IRTN(IR_MUL), tmp, tmp);
    }
    ref = emitir(IRTN(IR_MUL), ref, tmp);
  }
  return ref;
}